

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<Clasp::ShortImplicationsGraph::ImplicationList>
               (ImplicationList *first,ImplicationList *last,ImplicationList *x)

{
  ImplicationList *this;
  long in_RSI;
  long in_RDI;
  ImplicationList *in_stack_ffffffffffffffd8;
  int local_10;
  long local_8;
  
  local_10 = (int)in_RSI;
  local_8._0_4_ = (int)in_RDI;
  this = (ImplicationList *)(ulong)((uint)(local_10 - (int)local_8) >> 6 & 7);
  local_8 = in_RDI;
  switch(this) {
  case (ImplicationList *)0x0:
    while (local_8 != in_RSI) {
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_7:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_6:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_5:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_4:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_3:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_2:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
switchD_001daed6_caseD_1:
      local_8 = local_8 + 0x40;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList
                (this,in_stack_ffffffffffffffd8);
    }
    break;
  case (ImplicationList *)0x1:
    goto switchD_001daed6_caseD_1;
  case (ImplicationList *)0x2:
    goto switchD_001daed6_caseD_2;
  case (ImplicationList *)0x3:
    goto switchD_001daed6_caseD_3;
  case (ImplicationList *)0x4:
    goto switchD_001daed6_caseD_4;
  case (ImplicationList *)0x5:
    goto switchD_001daed6_caseD_5;
  case (ImplicationList *)0x6:
    goto switchD_001daed6_caseD_6;
  case (ImplicationList *)0x7:
    goto switchD_001daed6_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}